

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::initTestMessage(Builder builder)

{
  byte *pbVar1;
  char *pcVar2;
  undefined1 *puVar3;
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  PointerBuilder builder_03;
  PointerBuilder builder_04;
  PointerBuilder builder_05;
  CapTableBuilder *pCVar4;
  byte *b;
  long lVar5;
  ulong uVar6;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Reader value_05;
  Reader value_06;
  Reader value_07;
  Reader value_08;
  Reader value_09;
  Reader value_10;
  ArrayPtr<const_bool> value_11;
  ArrayPtr<const_capnp::Text::Reader> value_12;
  ArrayPtr<const_capnp::Data::Reader> value_13;
  ArrayPtr<const_bool> value_14;
  ArrayPtr<const_capnp::Text::Reader> value_15;
  ArrayPtr<const_capnp::Data::Reader> value_16;
  SegmentBuilder *in_stack_00000008;
  CapTableBuilder *in_stack_00000010;
  byte *in_stack_00000018;
  Builder subBuilder;
  Builder subSubBuilder;
  StructBuilder local_f8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  PointerBuilder local_98;
  StructBuilder local_78;
  CapTableBuilder *local_48;
  byte *local_40;
  SegmentBuilder *local_38;
  
  *in_stack_00000018 = *in_stack_00000018 | 1;
  in_stack_00000018[1] = 0x85;
  in_stack_00000018[2] = 199;
  in_stack_00000018[3] = 0xcf;
  in_stack_00000018[4] = 0xb2;
  in_stack_00000018[5] = 0x9e;
  in_stack_00000018[6] = 0x43;
  in_stack_00000018[7] = 0xff;
  in_stack_00000018[8] = 0x87;
  in_stack_00000018[9] = 0x20;
  in_stack_00000018[10] = 0xf2;
  in_stack_00000018[0xb] = 0x79;
  in_stack_00000018[0xc] = 0xb7;
  in_stack_00000018[0xd] = 0x8f;
  in_stack_00000018[0xe] = 0xff;
  in_stack_00000018[0xf] = 0xff;
  in_stack_00000018[0x10] = 0xea;
  in_stack_00000018[0x12] = 0x6e;
  in_stack_00000018[0x13] = 0xb2;
  in_stack_00000018[0x14] = 0x14;
  in_stack_00000018[0x15] = 0x6a;
  in_stack_00000018[0x16] = 10;
  in_stack_00000018[0x17] = 0xce;
  in_stack_00000018[0x18] = 0xd2;
  in_stack_00000018[0x19] = 10;
  in_stack_00000018[0x1a] = 0x1f;
  in_stack_00000018[0x1b] = 0xeb;
  in_stack_00000018[0x1c] = 0x8c;
  in_stack_00000018[0x1d] = 0xa9;
  in_stack_00000018[0x1e] = 0x54;
  in_stack_00000018[0x1f] = 0xab;
  in_stack_00000018[0x20] = 0;
  in_stack_00000018[0x21] = 0x50;
  in_stack_00000018[0x22] = 0x9a;
  in_stack_00000018[0x23] = 0x44;
  local_40 = in_stack_00000018;
  in_stack_00000018[0x28] = 0;
  in_stack_00000018[0x29] = 0xbb;
  in_stack_00000018[0x2a] = 0xe0;
  in_stack_00000018[0x2b] = 0xc0;
  in_stack_00000018[0x2c] = 0x82;
  in_stack_00000018[0x2d] = 0x8b;
  in_stack_00000018[0x2e] = 0xb5;
  in_stack_00000018[0x2f] = 0xc9;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_c8,value);
  local_c8._16_8_ = &((subBuilder._builder.segment)->super_SegmentReader).id;
  value_00.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  value_00.super_ArrayPtr<const_unsigned_char>.ptr = "bar";
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)local_c8,value_00);
  local_c8._16_8_ = &((subBuilder._builder.segment)->super_SegmentReader).ptr;
  local_38 = in_stack_00000008;
  local_48 = in_stack_00000010;
  PointerBuilder::initStruct(&local_f8,(PointerBuilder *)local_c8,(StructSize)0x140006);
  *(byte *)local_f8.data = *local_f8.data | 1;
  *(byte *)((long)local_f8.data + 1) = 0xf4;
  ((byte *)((long)local_f8.data + 2))[0] = 0x80;
  ((byte *)((long)local_f8.data + 2))[1] = 0xd;
  pbVar1 = (byte *)((long)local_f8.data + 4);
  pbVar1[0] = 0xe;
  pbVar1[1] = 0x10;
  pbVar1[2] = 0x4c;
  pbVar1[3] = 0xfb;
  pbVar1 = (byte *)((long)local_f8.data + 8);
  pbVar1[0] = 0x4e;
  pbVar1[1] = 0x73;
  pbVar1[2] = 0xe8;
  pbVar1[3] = 0x38;
  pbVar1[4] = 0xa6;
  pbVar1[5] = 0x33;
  pbVar1[6] = 0;
  pbVar1[7] = 0;
  *(byte *)((long)local_f8.data + 0x10) = 0x5a;
  ((byte *)((long)local_f8.data + 0x12))[0] = 0xd2;
  ((byte *)((long)local_f8.data + 0x12))[1] = 4;
  pbVar1 = (byte *)((long)local_f8.data + 0x14);
  pbVar1[0] = 0x14;
  pbVar1[1] = 0x88;
  pbVar1[2] = 0x62;
  pbVar1[3] = 3;
  pbVar1 = (byte *)((long)local_f8.data + 0x18);
  pbVar1[0] = 0xd2;
  pbVar1[1] = 10;
  pbVar1[2] = 0x6f;
  pbVar1[3] = 0x12;
  pbVar1[4] = 0x21;
  pbVar1[5] = 0x19;
  pbVar1[6] = 0xcc;
  pbVar1[7] = 4;
  pbVar1 = (byte *)((long)local_f8.data + 0x20);
  pbVar1[0] = 0x5f;
  pbVar1[1] = 0x70;
  pbVar1[2] = 9;
  pbVar1[3] = 0xaf;
  pbVar1 = (byte *)((long)local_f8.data + 0x28);
  pbVar1[0] = 0;
  pbVar1[1] = 0;
  pbVar1[2] = 0;
  pbVar1[3] = 0;
  pbVar1[4] = 0;
  pbVar1[5] = 0x90;
  pbVar1[6] = 0x75;
  pbVar1[7] = 0x40;
  local_c8._0_8_ = local_f8.segment;
  local_c8._8_8_ = local_f8.capTable;
  local_c8._16_8_ = local_f8.pointers;
  value_01.super_StringPtr.content.size_ = 4;
  value_01.super_StringPtr.content.ptr = "baz";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_c8,value_01);
  local_c8._16_8_ = local_f8.pointers + 1;
  local_c8._0_8_ = local_f8.segment;
  local_c8._8_8_ = local_f8.capTable;
  value_02.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  value_02.super_ArrayPtr<const_unsigned_char>.ptr = "qux";
  PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)local_c8,value_02);
  local_78.data = local_f8.pointers + 2;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)local_c8,(PointerBuilder *)&local_78,(StructSize)0x140006);
  local_78.segment = (SegmentBuilder *)local_c8._0_8_;
  local_78.capTable = (CapTableBuilder *)local_c8._8_8_;
  local_78.data = local_b0;
  value_03.super_StringPtr.content.size_ = 7;
  value_03.super_StringPtr.content.ptr = "nested";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_78,value_03);
  local_98.pointer = local_b0 + 2;
  local_98.segment = (SegmentBuilder *)local_c8._0_8_;
  local_98.capTable = (CapTableBuilder *)local_c8._8_8_;
  PointerBuilder::initStruct(&local_78,&local_98,(StructSize)0x140006);
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  local_98.pointer = local_78.pointers;
  value_04.super_StringPtr.content.size_ = 0xe;
  value_04.super_StringPtr.content.ptr = "really nested";
  PointerBuilder::setBlob<capnp::Text>(&local_98,value_04);
  ((byte *)((long)local_f8.data + 0x24))[0] = 2;
  ((byte *)((long)local_f8.data + 0x24))[1] = 0;
  local_78.data = local_f8.pointers + 3;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  uVar6 = 0;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,VOID,3);
  local_78.segment = (SegmentBuilder *)CONCAT35(local_78.segment._5_3_,0x101000100);
  local_c8._16_8_ = local_f8.pointers + 4;
  local_c8._0_8_ = local_f8.segment;
  local_c8._8_8_ = local_f8.capTable;
  builder_00.capTable = local_f8.capTable;
  builder_00.segment = local_f8.segment;
  builder_00.pointer = (WirePointer *)local_c8._16_8_;
  value_11.size_ = 5;
  value_11.ptr = (bool *)&local_78;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value_11);
  local_98.segment = (SegmentBuilder *)CONCAT44(local_98.segment._4_4_,0x7f80de0c);
  local_78.data = local_f8.pointers + 5;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,BYTE,4);
  lVar5 = 0;
  do {
    puVar3 = (undefined1 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 1;
    *(undefined1 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) = *puVar3
    ;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 4);
  local_98.segment = (SegmentBuilder *)0x7fff8000e9d204d2;
  local_78.data = local_f8.pointers + 6;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,TWO_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined2 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 2;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 8);
  local_98.segment = (SegmentBuilder *)0xfaa0d34000bc614e;
  local_98.capTable = (CapTableBuilder *)0x7fffffff80000000;
  local_78.data = local_f8.pointers + 7;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,FOUR_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined4 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 4;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 0x10);
  local_78.data = local_f8.pointers + 8;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,EIGHT_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined8 *)((long)&DAT_002a8610 + lVar5);
    lVar5 = lVar5 + 8;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 0x20);
  local_98.segment = (SegmentBuilder *)CONCAT44(local_98.segment._4_4_,0xff00220c);
  local_78.data = local_f8.pointers + 9;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,BYTE,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    puVar3 = (undefined1 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 1;
    *(undefined1 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) = *puVar3
    ;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 4);
  local_98.segment = (SegmentBuilder *)0xffff0000162e04d2;
  local_78.data = local_f8.pointers + 10;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,TWO_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined2 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 2;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 8);
  local_98.segment = (SegmentBuilder *)0x55f2cc000bc614e;
  local_98.capTable = (CapTableBuilder *)0xffffffff00000000;
  local_78.data = local_f8.pointers + 0xb;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,FOUR_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined4 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 4;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 0x10);
  local_78.data = local_f8.pointers + 0xc;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,EIGHT_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined8 *)((long)&DAT_002a8630 + lVar5);
    lVar5 = lVar5 + 8;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 0x20);
  local_78.data = local_f8.pointers + 0xd;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,FOUR_BYTES,6);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined4 *)((long)&DAT_002bf3fc + lVar5);
    lVar5 = lVar5 + 4;
    uVar6 = uVar6 + local_b0._4_4_;
  } while (lVar5 != 0x18);
  local_78.data = local_f8.pointers + 0xe;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,EIGHT_BYTES,6);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined8 *)((long)&DAT_002bf418 + lVar5);
    lVar5 = lVar5 + 8;
    uVar6 = uVar6 + local_b0._4_4_;
  } while (lVar5 != 0x30);
  local_c8._0_8_ = "quux";
  local_c8._8_8_ = &DAT_00000005;
  local_c8._16_8_ = "corge";
  local_b0 = (WirePointer *)0x6;
  local_a8 = "grault";
  local_a0 = 7;
  local_78.data = local_f8.pointers + 0xf;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  builder_01.capTable = local_f8.capTable;
  builder_01.segment = local_f8.segment;
  builder_01.pointer = (WirePointer *)local_78.data;
  value_12.size_ = 3;
  value_12.ptr = (Reader *)local_c8;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_01,value_12)
  ;
  local_c8._0_8_ = "garply";
  local_c8._8_8_ = (CapTableBuilder *)0x6;
  local_c8._16_8_ = anon_var_dwarf_b3bb6;
  local_b0 = (WirePointer *)&DAT_00000005;
  local_a8 = "fred";
  local_a0 = 4;
  local_78.data = local_f8.pointers + 0x10;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  builder_02.capTable = local_f8.capTable;
  builder_02.segment = local_f8.segment;
  builder_02.pointer = (WirePointer *)local_78.data;
  value_13.size_ = 3;
  value_13.ptr = (Reader *)local_c8;
  PointerHelpers<capnp::List<capnp::Data,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_02,value_13)
  ;
  local_78.data = local_f8.pointers + 0x11;
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_78,3,(StructSize)0x140006);
  uVar6 = 0;
  ListBuilder::getStructElement(&local_78,(ListBuilder *)local_c8,0);
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  local_98.pointer = local_78.pointers;
  value_05.super_StringPtr.content.size_ = 0xf;
  value_05.super_StringPtr.content.ptr = "x structlist 1";
  PointerBuilder::setBlob<capnp::Text>(&local_98,value_05);
  ListBuilder::getStructElement(&local_78,(ListBuilder *)local_c8,1);
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  local_98.pointer = local_78.pointers;
  value_06.super_StringPtr.content.size_ = 0xf;
  value_06.super_StringPtr.content.ptr = "x structlist 2";
  PointerBuilder::setBlob<capnp::Text>(&local_98,value_06);
  ListBuilder::getStructElement(&local_78,(ListBuilder *)local_c8,2);
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  local_98.pointer = local_78.pointers;
  value_07.super_StringPtr.content.size_ = 0xf;
  value_07.super_StringPtr.content.ptr = "x structlist 3";
  PointerBuilder::setBlob<capnp::Text>(&local_98,value_07);
  local_78.data = local_f8.pointers + 0x12;
  local_98.segment = (SegmentBuilder *)CONCAT26(local_98.segment._6_2_,0x600010003);
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_78,TWO_BYTES,3);
  pCVar4 = local_48;
  lVar5 = 0;
  do {
    *(undefined2 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined2 *)((long)&local_98.segment + lVar5);
    lVar5 = lVar5 + 2;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 6);
  local_40[0x24] = 5;
  local_40[0x25] = 0;
  local_f8.data = &((subBuilder._builder.segment)->super_SegmentReader).ptr.size_;
  local_f8.segment = local_38;
  local_f8.capTable = local_48;
  uVar6 = 0;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,VOID,6);
  local_f8.segment = (SegmentBuilder *)CONCAT44(local_f8.segment._4_4_,0x1000001);
  local_c8._16_8_ = &((subBuilder._builder.segment)->super_SegmentReader).readLimiter;
  local_c8._0_8_ = local_38;
  local_c8._8_8_ = pCVar4;
  builder_03.capTable = pCVar4;
  builder_03.segment = local_38;
  builder_03.pointer = (WirePointer *)local_c8._16_8_;
  value_14.size_ = 4;
  value_14.ptr = (bool *)&local_f8;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_03,value_14);
  local_f8.data = &(subBuilder._builder.segment)->pos;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,BYTE,2);
  *(undefined1 *)&((WireValue<uint32_t> *)local_c8._16_8_)->value = 0x6f;
  *(undefined1 *)
   ((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + ((ulong)local_b0 >> 0x23)) = 0x91;
  local_f8.data = &(subBuilder._builder.segment)->readOnly;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,TWO_BYTES,2);
  *(undefined2 *)&((WireValue<uint32_t> *)local_c8._16_8_)->value = 0x2b67;
  *(undefined2 *)
   ((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + ((ulong)local_b0 >> 0x23)) = 0xd499;
  local_f8.data = subBuilder._builder.segment + 1;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,FOUR_BYTES,2);
  ((WireValue<uint32_t> *)local_c8._16_8_)->value = 0x69f6bc7;
  *(undefined4 *)
   ((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + ((ulong)local_b0 >> 0x23)) = 0xf9609439
  ;
  local_f8.data = &subBuilder._builder.segment[1].super_SegmentReader.id;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,EIGHT_BYTES,2);
  *(WirePointer *)local_c8._16_8_ = (WirePointer)0xf6b75ab2bc471c7;
  *(undefined8 *)
   ((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + ((ulong)local_b0 >> 0x23)) =
       0xf0948a54d43b8e39;
  local_f8.data = &subBuilder._builder.segment[1].super_SegmentReader.ptr;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,BYTE,2);
  *(undefined1 *)&((WireValue<uint32_t> *)local_c8._16_8_)->value = 0x6f;
  *(undefined1 *)
   ((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + ((ulong)local_b0 >> 0x23)) = 0xde;
  local_f8.data = &subBuilder._builder.segment[1].super_SegmentReader.ptr.size_;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,TWO_BYTES,2);
  *(undefined2 *)&((WireValue<uint32_t> *)local_c8._16_8_)->value = 0x8235;
  *(undefined2 *)
   ((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + ((ulong)local_b0 >> 0x23)) = 0xad9c;
  local_f8.data = &subBuilder._builder.segment[1].super_SegmentReader.readLimiter;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,FOUR_BYTES,1);
  ((WireValue<uint32_t> *)local_c8._16_8_)->value = 0xc6aea155;
  local_f8.data = &subBuilder._builder.segment[1].pos;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,EIGHT_BYTES,1);
  *(WirePointer *)local_c8._16_8_ = (WirePointer)0x9a3298afb5ac71c7;
  local_78.segment = (SegmentBuilder *)0x7f80000045ad9c00;
  local_78.capTable = (CapTableBuilder *)0x7fc00000ff800000;
  local_f8.data = &subBuilder._builder.segment[1].readOnly;
  local_f8.segment = local_38;
  local_f8.capTable = pCVar4;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,FOUR_BYTES,4);
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined4 *)((long)&local_78.segment + lVar5);
    lVar5 = lVar5 + 4;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 0x10);
  local_f8.data = subBuilder._builder.segment + 2;
  local_f8.segment = local_38;
  local_f8.capTable = local_48;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,EIGHT_BYTES,4);
  uVar6 = 0;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value + (uVar6 >> 3)) =
         *(undefined8 *)((long)&DAT_002bfd88 + lVar5);
    lVar5 = lVar5 + 8;
    uVar6 = uVar6 + ((ulong)local_b0 >> 0x20);
  } while (lVar5 != 0x20);
  local_c8._0_8_ = "plugh";
  local_c8._8_8_ = (CapTableBuilder *)0x6;
  local_c8._16_8_ = "xyzzy";
  local_b0 = (WirePointer *)0x6;
  local_a8 = "thud";
  local_a0 = 5;
  local_f8.data = &subBuilder._builder.segment[2].super_SegmentReader.id;
  local_f8.segment = local_38;
  local_f8.capTable = local_48;
  builder_04.capTable = local_48;
  builder_04.segment = local_38;
  builder_04.pointer = (WirePointer *)local_f8.data;
  value_15.size_ = 3;
  value_15.ptr = (Reader *)local_c8;
  PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_04,value_15)
  ;
  local_c8._0_8_ = "oops";
  local_c8._8_8_ = (CapTableBuilder *)0x4;
  local_c8._16_8_ = anon_var_dwarf_b5bf4;
  local_b0 = (WirePointer *)&DAT_00000009;
  local_a8 = "rfc3092";
  local_a0 = 7;
  local_f8.data = &subBuilder._builder.segment[2].super_SegmentReader.ptr;
  local_f8.segment = local_38;
  local_f8.capTable = local_48;
  builder_05.capTable = local_48;
  builder_05.segment = local_38;
  builder_05.pointer = (WirePointer *)local_f8.data;
  value_16.size_ = 3;
  value_16.ptr = (Reader *)local_c8;
  PointerHelpers<capnp::List<capnp::Data,_(capnp::Kind)1>,_(capnp::Kind)6>::set(builder_05,value_16)
  ;
  local_f8.data = &subBuilder._builder.segment[2].super_SegmentReader.ptr.size_;
  local_f8.segment = local_38;
  local_f8.capTable = local_48;
  PointerBuilder::initStructList
            ((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,3,(StructSize)0x140006);
  ListBuilder::getStructElement(&local_f8,(ListBuilder *)local_c8,0);
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  local_78.data = local_f8.pointers;
  value_08.super_StringPtr.content.size_ = 0xd;
  value_08.super_StringPtr.content.ptr = "structlist 1";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_78,value_08);
  ListBuilder::getStructElement(&local_f8,(ListBuilder *)local_c8,1);
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  local_78.data = local_f8.pointers;
  value_09.super_StringPtr.content.size_ = 0xd;
  value_09.super_StringPtr.content.ptr = "structlist 2";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_78,value_09);
  ListBuilder::getStructElement(&local_f8,(ListBuilder *)local_c8,2);
  local_78.segment = local_f8.segment;
  local_78.capTable = local_f8.capTable;
  local_78.data = local_f8.pointers;
  value_10.super_StringPtr.content.size_ = 0xd;
  value_10.super_StringPtr.content.ptr = "structlist 3";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_78,value_10);
  local_f8.data = &subBuilder._builder.segment[2].super_SegmentReader.readLimiter;
  local_f8.segment = local_38;
  local_f8.capTable = local_48;
  PointerBuilder::initList((ListBuilder *)local_c8,(PointerBuilder *)&local_f8,TWO_BYTES,2);
  *(undefined2 *)&((WireValue<uint32_t> *)local_c8._16_8_)->value = 0;
  pcVar2 = (char *)((long)&((WireValue<uint32_t> *)local_c8._16_8_)->value +
                   ((ulong)local_b0 >> 0x23));
  pcVar2[0] = '\a';
  pcVar2[1] = '\0';
  return;
}

Assistant:

void initTestMessage(TestAllTypes::Builder builder) { genericInitTestMessage(builder); }